

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

bool is_pdf_name(string *v)

{
  int iVar1;
  bool bVar2;
  long *local_30 [2];
  long local_20 [2];
  
  if (v->_M_string_length < 4) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_30,(ulong)v);
    iVar1 = std::__cxx11::string::compare((char *)local_30);
    bVar2 = iVar1 == 0;
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

static bool
is_pdf_name(std::string const& v)
{
    return ((v.length() > 3) && (v.substr(0, 3) == "n:/"));
}